

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O1

void __thiscall icu_63::DateFormatSymbols::disposeZoneStrings(DateFormatSymbols *this)

{
  UnicodeString ***pppUVar1;
  UnicodeString *pUVar2;
  void *in_RSI;
  long lVar3;
  long lVar4;
  
  pppUVar1 = &this->fZoneStrings;
  if (this->fZoneStrings != (UnicodeString **)0x0) {
    if (0 < this->fZoneStringsRowCount) {
      lVar3 = 0;
      do {
        pUVar2 = (*pppUVar1)[lVar3];
        if (pUVar2 != (UnicodeString *)0x0) {
          lVar4 = *(long *)((long)&pUVar2[-1].fUnion + 0x30);
          if (lVar4 != 0) {
            lVar4 = lVar4 << 6;
            do {
              icu_63::UnicodeString::~UnicodeString
                        ((UnicodeString *)
                         ((long)&pUVar2[-1].super_Replaceable.super_UObject._vptr_UObject + lVar4));
              lVar4 = lVar4 + -0x40;
            } while (lVar4 != 0);
          }
          UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),in_RSI);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->fZoneStringsRowCount);
    }
    uprv_free_63(*pppUVar1);
  }
  if (this->fLocaleZoneStrings != (UnicodeString **)0x0) {
    if (0 < this->fZoneStringsRowCount) {
      lVar3 = 0;
      do {
        pUVar2 = this->fLocaleZoneStrings[lVar3];
        if (pUVar2 != (UnicodeString *)0x0) {
          lVar4 = *(long *)((long)&pUVar2[-1].fUnion + 0x30);
          if (lVar4 != 0) {
            lVar4 = lVar4 << 6;
            do {
              icu_63::UnicodeString::~UnicodeString
                        ((UnicodeString *)
                         ((long)&pUVar2[-1].super_Replaceable.super_UObject._vptr_UObject + lVar4));
              lVar4 = lVar4 + -0x40;
            } while (lVar4 != 0);
          }
          UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),in_RSI);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->fZoneStringsRowCount);
    }
    uprv_free_63(this->fLocaleZoneStrings);
  }
  *pppUVar1 = (UnicodeString **)0x0;
  this->fLocaleZoneStrings = (UnicodeString **)0x0;
  this->fZoneStringsRowCount = 0;
  this->fZoneStringsColCount = 0;
  return;
}

Assistant:

void DateFormatSymbols::disposeZoneStrings()
{
    if (fZoneStrings) {
        for (int32_t row = 0; row < fZoneStringsRowCount; ++row) {
            delete[] fZoneStrings[row];
        }
        uprv_free(fZoneStrings);
    }
    if (fLocaleZoneStrings) {
        for (int32_t row = 0; row < fZoneStringsRowCount; ++row) {
            delete[] fLocaleZoneStrings[row];
        }
        uprv_free(fLocaleZoneStrings);
    }

    fZoneStrings = NULL;
    fLocaleZoneStrings = NULL;
    fZoneStringsRowCount = 0;
    fZoneStringsColCount = 0;
}